

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void set_ar_ksr(UINT8 type,FM_CH *CH,FM_SLOT *SLOT,int v)

{
  UINT8 UVar1;
  UINT32 local_2c;
  UINT8 old_KSR;
  int v_local;
  FM_SLOT *SLOT_local;
  FM_CH *CH_local;
  UINT8 type_local;
  
  UVar1 = SLOT->KSR;
  if ((v & 0x1fU) == 0) {
    local_2c = 0;
  }
  else {
    local_2c = (v & 0x1fU) * 2 + 0x20;
  }
  SLOT->ar = local_2c;
  SLOT->KSR = '\x03' - (char)(v >> 6);
  if (SLOT->KSR != UVar1) {
    CH->SLOT[0].Incr = -1;
  }
  if (SLOT->ar + (uint)SLOT->ksr < 0x5e) {
    SLOT->eg_sh_ar =
         "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
         [SLOT->ar + (uint)SLOT->ksr];
    SLOT->eg_sel_ar = eg_rate_select[SLOT->ar + (uint)SLOT->ksr];
  }
  else {
    SLOT->eg_sh_ar = '\0';
    SLOT->eg_sel_ar = 0x90;
  }
  return;
}

Assistant:

INLINE void set_ar_ksr(UINT8 type, FM_CH *CH,FM_SLOT *SLOT,int v)
{
	UINT8 old_KSR = SLOT->KSR;

	SLOT->ar = (v&0x1f) ? 32 + ((v&0x1f)<<1) : 0;

	SLOT->KSR = 3-(v>>6);
	if (SLOT->KSR != old_KSR)
	{
		CH->SLOT[SLOT1].Incr=-1;
	}

	/* Even if it seems unnecessary to do it here, it could happen that KSR and KC  */
	/* are modified but the resulted SLOT->ksr value (kc >> SLOT->KSR) remains unchanged. */
	/* In such case, Attack Rate would not be recalculated by "refresh_fc_eg_slot". */
	/* This actually fixes the intro of "The Adventures of Batman & Robin" (Eke-Eke)         */
	if ((SLOT->ar + SLOT->ksr) < (32+62))
	{
		SLOT->eg_sh_ar  = eg_rate_shift [SLOT->ar  + SLOT->ksr ];
		SLOT->eg_sel_ar = eg_rate_select[SLOT->ar  + SLOT->ksr ];
	}
	else
	{
		/* verified by Nemesis on real hardware (Attack phase is blocked) */
		SLOT->eg_sh_ar  = 0;
		SLOT->eg_sel_ar = 18*RATE_STEPS;
	}
}